

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O2

int run_test_semaphore_3(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_sem_t sem;
  
  iVar1 = uv_sem_init(&sem,3);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_sem_wait(&sem);
    uv_sem_wait(&sem);
    iVar1 = uv_sem_trywait(&sem);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = -0xb;
      iVar1 = uv_sem_trywait(&sem);
      eval_b = (int64_t)iVar1;
      if (eval_b == -0xb) {
        uv_sem_post(&sem);
        iVar1 = uv_sem_trywait(&sem);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = -0xb;
          iVar1 = uv_sem_trywait(&sem);
          eval_b = (int64_t)iVar1;
          if (eval_b == -0xb) {
            uv_sem_destroy(&sem);
            return 0;
          }
          pcVar3 = "uv_sem_trywait(&sem)";
          pcVar2 = "UV_EAGAIN";
          uVar4 = 0x6a;
        }
        else {
          pcVar3 = "0";
          pcVar2 = "uv_sem_trywait(&sem)";
          uVar4 = 0x69;
        }
      }
      else {
        pcVar3 = "uv_sem_trywait(&sem)";
        pcVar2 = "UV_EAGAIN";
        uVar4 = 0x66;
      }
    }
    else {
      pcVar3 = "0";
      pcVar2 = "uv_sem_trywait(&sem)";
      uVar4 = 0x65;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "uv_sem_init(&sem, 3)";
    uVar4 = 0x62;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(semaphore_3) {
  uv_sem_t sem;

  ASSERT_OK(uv_sem_init(&sem, 3));
  uv_sem_wait(&sem); /* should not block */
  uv_sem_wait(&sem); /* should not block */
  ASSERT_OK(uv_sem_trywait(&sem));
  ASSERT_EQ(UV_EAGAIN, uv_sem_trywait(&sem));

  uv_sem_post(&sem);
  ASSERT_OK(uv_sem_trywait(&sem));
  ASSERT_EQ(UV_EAGAIN, uv_sem_trywait(&sem));

  uv_sem_destroy(&sem);

  return 0;
}